

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O2

MPP_RET vepu541_set_fmt(VepuFmtCfg *cfg,MppFrameFormat format)

{
  RK_S32 *pRVar1;
  undefined4 uVar2;
  Vepu541Fmt VVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_U32 RVar6;
  VepuFmtCfg *pVVar7;
  MppFrameFormat MVar8;
  
  MVar8 = format & 0xfffff;
  if (MVar8 < MPP_FMT_YUV_BUTT && (format & 0xf0000) == MPP_FMT_YUV420SP) {
    pVVar7 = vepu541_yuv_cfg;
  }
  else {
    if (MPP_FMT_ARGB1555 < MVar8 || (format & 0xf0000) != MPP_FMT_RGB565) {
      cfg->format = VEPU541_FMT_BGRA8888;
      cfg->alpha_swap = 0;
      cfg->rbuv_swap = 0;
      cfg->src_range = 0;
      *(undefined8 *)&cfg->src_endian = 0;
      cfg->weight = (RK_S32 *)0x0;
      cfg->offset = (RK_S32 *)0x0;
      cfg->format = VEPU541_FMT_NONE;
      goto LAB_002548d6;
    }
    MVar8 = MVar8 - MPP_FMT_RGB565;
    pVVar7 = vepu541_rgb_cfg;
  }
  pVVar7 = pVVar7 + MVar8;
  if (pVVar7->format != VEPU541_FMT_NONE) {
    cfg->offset = pVVar7->offset;
    VVar3 = pVVar7->format;
    RVar4 = pVVar7->alpha_swap;
    RVar5 = pVVar7->rbuv_swap;
    RVar6 = pVVar7->src_range;
    uVar2 = *(undefined4 *)&pVVar7->field_0x14;
    pRVar1 = pVVar7->weight;
    cfg->src_endian = pVVar7->src_endian;
    *(undefined4 *)&cfg->field_0x14 = uVar2;
    cfg->weight = pRVar1;
    cfg->format = VVar3;
    cfg->alpha_swap = RVar4;
    cfg->rbuv_swap = RVar5;
    cfg->src_range = RVar6;
    return MPP_OK;
  }
LAB_002548d6:
  _mpp_log_l(2,"vepu541_common","unsupport frame format %x\n","vepu541_set_fmt");
  cfg->format = VEPU541_FMT_NONE;
  return MPP_NOK;
}

Assistant:

MPP_RET vepu541_set_fmt(VepuFmtCfg *cfg, MppFrameFormat format)
{
    VepuFmtCfg *fmt = NULL;
    MPP_RET ret = MPP_OK;

    format &= MPP_FRAME_FMT_MASK;

    if (MPP_FRAME_FMT_IS_YUV(format)) {
        fmt = &vepu541_yuv_cfg[format - MPP_FRAME_FMT_YUV];
    } else if (MPP_FRAME_FMT_IS_RGB(format)) {
        fmt = &vepu541_rgb_cfg[format - MPP_FRAME_FMT_RGB];
    } else {
        memset(cfg, 0, sizeof(*cfg));
        cfg->format = VEPU541_FMT_NONE;
    }

    if (fmt && fmt->format != VEPU541_FMT_NONE) {
        memcpy(cfg, fmt, sizeof(*cfg));
    } else {
        mpp_err_f("unsupport frame format %x\n", format);
        cfg->format = VEPU541_FMT_NONE;
        ret = MPP_NOK;
    }

    return ret;
}